

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmake *pcVar5;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  char cVar6;
  size_type sVar7;
  CURL_conflict *data;
  bool bVar8;
  int iVar9;
  uint uVar10;
  CURLcode CVar11;
  int iVar12;
  ostream *poVar13;
  long *plVar14;
  long lVar15;
  cmCTestScriptHandler *pcVar16;
  cmValue cVar17;
  unsigned_long uVar18;
  pointer pcVar19;
  string *psVar20;
  size_type *psVar21;
  undefined8 uVar22;
  char *extraout_RDX;
  string *arg;
  pointer pbVar23;
  cmCTestSubmitHandler *pcVar24;
  ulong uVar25;
  uint uVar26;
  size_t sVar27;
  string_view arg_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value;
  string retryDelay;
  cmCTestSubmitHandlerVectorOfChar chunk;
  string retryCount;
  string local_file;
  string upload_as;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  string remote_file;
  ostringstream cmCTestLog_msg;
  string ofile;
  string curlopt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char error_buffer [1024];
  Curl_easy *in_stack_fffffffffffff798;
  string local_860;
  CURL_conflict *local_830;
  byte local_821;
  cmCTestSubmitHandler *local_820;
  void *local_818;
  void *pvStack_810;
  long local_808;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  pointer local_798;
  curl_slist *local_790;
  string local_788;
  FILE *local_768;
  uint local_760;
  uint local_75c;
  void *local_758;
  void *pvStack_750;
  long local_748;
  string local_738;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_718;
  undefined1 local_710 [8];
  pointer local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  pointer local_6f0;
  _Alloc_hider local_6e8;
  size_type local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8 [3];
  ios_base local_6a0 [264];
  string local_598;
  cmCTestSubmitHandlerVectorOfChar local_578;
  cmCTestSubmitHandlerVectorOfChar local_558;
  string local_540;
  string local_520;
  string *local_500;
  string *local_4f8;
  string *local_4f0;
  pointer local_4e8;
  double local_4e0;
  double local_4d8;
  string local_4d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  string local_498;
  string local_478;
  string local_458;
  char local_438 [1032];
  
  local_718 = files;
  local_500 = localprefix;
  local_4f8 = url;
  local_4f0 = remoteprefix;
  local_790 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar23 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->HttpHeaders).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_820 = this;
  if (pbVar23 != pbVar1) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_710,"   Add HTTP Header: \"",0x15);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_710,(pbVar23->_M_dataplus)._M_p,
                           pbVar23->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x9c,local_860._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_860._M_dataplus._M_p != &local_860.field_2) {
        operator_delete(local_860._M_dataplus._M_p,
                        CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                 local_860.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
      std::ios_base::~ios_base(local_6a0);
      local_790 = curl_slist_append(local_790,(pbVar23->_M_dataplus)._M_p);
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar1);
  }
  curl_global_init(3);
  pcVar24 = local_820;
  pcVar2 = (local_820->super_cmCTestGenericHandler).CTest;
  local_710 = (undefined1  [8])&local_700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"CurlOptions","");
  cmCTest::GetCTestConfiguration(&local_4d0,pcVar2,(string *)local_710);
  if (local_710 != (undefined1  [8])&local_700) {
    operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
  }
  arg_00._M_str = local_4d0._M_dataplus._M_p;
  arg_00._M_len = local_4d0._M_string_length;
  cmExpandedList_abi_cxx11_(&local_4b0,arg_00,false);
  if (local_4b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_4b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_760 = 0;
    local_75c = 0;
  }
  else {
    uVar10 = 0;
    uVar26 = 0;
    pbVar23 = local_4b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar9 = std::__cxx11::string::compare((char *)pbVar23);
      if (iVar9 == 0) {
        uVar10 = 1;
      }
      iVar9 = std::__cxx11::string::compare((char *)pbVar23);
      if (iVar9 == 0) {
        uVar26 = 1;
      }
      pbVar23 = pbVar23 + 1;
      pcVar24 = local_820;
      local_760 = uVar26;
      local_75c = uVar10;
    } while (pbVar23 !=
             local_4b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_798 = (local_718->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4e8 = (local_718->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_821 = local_798 == local_4e8;
  do {
    if ((bool)local_821) {
      curl_slist_free_all(local_790);
      curl_global_cleanup();
LAB_001f0eec:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      return (bool)(local_821 & 1);
    }
    local_830 = curl_easy_init();
    if (local_830 != (CURL_conflict *)0x0) {
      local_710 = (undefined1  [8])&local_700;
      local_708 = (pointer)0x0;
      local_700._M_allocated_capacity = local_700._M_allocated_capacity & 0xffffffffffffff00;
      cmCurlSetCAInfo(&local_458,local_830,(string *)local_710);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if (local_710 != (undefined1  [8])&local_700) {
        operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
      }
      if ((local_75c & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"  Set CURLOPT_SSL_VERIFYPEER to off\n",0x24);
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb6,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        curl_easy_setopt(local_830,CURLOPT_SSL_VERIFYPEER,0);
      }
      if ((local_760 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"  Set CURLOPT_SSL_VERIFYHOST to off\n",0x24);
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xbc,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        curl_easy_setopt(local_830,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < pcVar24->HTTPProxyType) {
        curl_easy_setopt(local_830,CURLOPT_PROXY,(pcVar24->HTTPProxy)._M_dataplus._M_p);
        if (pcVar24->HTTPProxyType == 2) {
          uVar22 = 4;
        }
        else {
          if (pcVar24->HTTPProxyType != 3) {
            curl_easy_setopt(local_830,CURLOPT_PROXYTYPE,0);
            if ((pcVar24->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(local_830,CURLOPT_PROXYUSERPWD,
                               (pcVar24->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_001ef36a;
          }
          uVar22 = 5;
        }
        curl_easy_setopt(local_830,CURLOPT_PROXYTYPE,uVar22);
      }
LAB_001ef36a:
      bVar8 = cmCTest::ShouldUseHTTP10((pcVar24->super_cmCTestGenericHandler).CTest);
      if (bVar8) {
        curl_easy_setopt(local_830,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(local_830,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(local_830,CURLOPT_UPLOAD,1);
      curl_easy_setopt(local_830,CURLOPT_LOW_SPEED_LIMIT,1);
      uVar10 = GetSubmitInactivityTimeout(pcVar24);
      if (uVar10 != 0) {
        curl_easy_setopt(local_830,CURLOPT_LOW_SPEED_TIME,(ulong)uVar10);
      }
      curl_easy_setopt(local_830,CURLOPT_PUT,1);
      curl_easy_setopt(local_830,CURLOPT_VERBOSE,1);
      curl_easy_setopt(local_830,CURLOPT_HTTPHEADER,local_790);
      local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
      pcVar3 = (local_798->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7b8,pcVar3,pcVar3 + local_798->_M_string_length);
      bVar8 = cmsys::SystemTools::FileExists(&local_7b8);
      if (!bVar8) {
        local_708 = (local_500->_M_dataplus)._M_p;
        local_710 = (undefined1  [8])local_500->_M_string_length;
        local_700._M_allocated_capacity = 1;
        local_700._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
        local_6e8._M_p = (local_798->_M_dataplus)._M_p;
        local_6f0 = (pointer)local_798->_M_string_length;
        views._M_len = 3;
        views._M_array = (iterator)local_710;
        cmCatViews_abi_cxx11_(&local_860,views);
        std::__cxx11::string::operator=((string *)&local_7b8,(string *)&local_860);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
      }
      cmsys::SystemTools::GetFilenameName((string *)local_710,local_798);
      plVar14 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_710,0,(char *)0x0,
                                   (ulong)(local_4f0->_M_dataplus)._M_p);
      local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
      psVar21 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_738.field_2._M_allocated_capacity = *psVar21;
        local_738.field_2._8_8_ = plVar14[3];
      }
      else {
        local_738.field_2._M_allocated_capacity = *psVar21;
        local_738._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_738._M_string_length = plVar14[1];
      *plVar14 = (long)psVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if (local_710 != (undefined1  [8])&local_700) {
        operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
      }
      poVar13 = pcVar24->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\tUpload file: ",0xe);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_7b8._M_dataplus._M_p,local_7b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_738._M_dataplus._M_p,local_738._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      cmSystemTools::EncodeURL(&local_598,&local_738,true);
      pcVar3 = (local_4f8->_M_dataplus)._M_p;
      pcVar4 = (pointer)local_4f8->_M_string_length;
      lVar15 = std::__cxx11::string::find((char)local_4f8,0x3f);
      local_860.field_2._M_local_buf[0] = '&';
      if (lVar15 == -1) {
        local_860.field_2._M_local_buf[0] = '?';
      }
      local_860._M_dataplus._M_p = &DAT_00000001;
      local_860._M_string_length = (size_type)&local_860.field_2;
      local_700._M_allocated_capacity = 1;
      local_6f0 = (pointer)0x9;
      local_6e8._M_p = "FileName=";
      local_6e0 = local_598._M_string_length;
      local_6d8[0]._M_allocated_capacity = local_598._M_dataplus._M_p;
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_710;
      local_710 = (undefined1  [8])pcVar4;
      local_708 = pcVar3;
      local_700._8_8_ = local_860._M_string_length;
      cmCatViews_abi_cxx11_(&local_788,views_00);
      if (!bVar8) {
        cmCTestCurl::cmCTestCurl
                  ((cmCTestCurl *)local_710,(pcVar24->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::append((char *)&local_788);
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"BuildName","");
        cmCTest::GetCTestConfiguration(&local_7d8,pcVar2,&local_7f8);
        cmCTestCurl::Escape(&local_860,(cmCTestCurl *)local_710,&local_7d8);
        std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_860._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
          operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_788);
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"Site","");
        cmCTest::GetCTestConfiguration(&local_7d8,pcVar2,&local_7f8);
        cmCTestCurl::Escape(&local_860,(cmCTestCurl *)local_710,&local_7d8);
        std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_860._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
          operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_788);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_7d8,(pcVar24->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_860,(cmCTestCurl *)local_710,&local_7d8);
        std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_860._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_788);
        cmCTest::GetTestModelString_abi_cxx11_
                  (&local_7d8,(pcVar24->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_860,(cmCTestCurl *)local_710,&local_7d8);
        std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_860._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        pcVar16 = cmCTest::GetScriptHandler((pcVar24->super_cmCTestGenericHandler).CTest);
        pcVar5 = (pcVar16->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
                 _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
        if (pcVar5 != (cmake *)0x0) {
          this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
          super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
               (pcVar5->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
          local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"SubProject","");
          cVar17 = cmState::GetGlobalProperty
                             ((cmState *)
                              this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                              _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_860);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,
                            CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                     local_860.field_2._M_local_buf[0]) + 1);
          }
          if (cVar17.Value != (string *)0x0) {
            std::__cxx11::string::append((char *)&local_788);
            cmCTestCurl::Escape(&local_860,(cmCTestCurl *)local_710,cVar17.Value);
            std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_860._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_860._M_dataplus._M_p != &local_860.field_2) {
              operator_delete(local_860._M_dataplus._M_p,
                              CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                       local_860.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_710);
      }
      iVar9 = std::__cxx11::string::compare((char *)local_798);
      if (iVar9 == 0) {
        cmCTest::GenerateDoneFile((pcVar24->super_cmCTestGenericHandler).CTest);
      }
      std::__cxx11::string::append((char *)&local_788);
      local_710 = (undefined1  [8])&local_700;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"InternalTest","");
      cVar17 = cmCTestGenericHandler::GetOption
                         (&pcVar24->super_cmCTestGenericHandler,(string *)local_710);
      if (cVar17.Value == (string *)0x0) {
        bVar8 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar17.Value)->_M_dataplus)._M_p;
        bVar8 = cmValue::IsOn((cmValue *)(cVar17.Value)->_M_string_length,value);
      }
      if (local_710 != (undefined1  [8])&local_700) {
        operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
      }
      if (bVar8 == false) {
        cmSystemTools::ComputeFileHash((string *)local_710,&local_7b8,AlgoMD5);
        std::__cxx11::string::_M_append((char *)&local_788,(ulong)local_710);
        if (local_710 != (undefined1  [8])&local_700) {
          operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_788);
      }
      bVar8 = cmsys::SystemTools::FileExists(&local_7b8);
      if (!bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"   Cannot find file: ",0x15);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_710,local_7b8._M_dataplus._M_p,
                             local_7b8._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x12a,local_860._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        curl_easy_cleanup(in_stack_fffffffffffff798);
        curl_slist_free_all(local_790);
        curl_global_cleanup();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_788._M_dataplus._M_p != &local_788.field_2) {
          operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
          operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001f0eec;
      }
      uVar18 = cmsys::SystemTools::FileLength(&local_7b8);
      local_768 = (FILE *)cmsys::SystemTools::Fopen(&local_7b8,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_710,"   Upload file: ",0x10);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_710,local_7b8._M_dataplus._M_p,
                           local_7b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,local_788._M_dataplus._M_p,local_788._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," Size: ",7);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x137,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_860._M_dataplus._M_p != &local_860.field_2) {
        operator_delete(local_860._M_dataplus._M_p,
                        CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                 local_860.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
      std::ios_base::~ios_base(local_6a0);
      data = local_830;
      curl_easy_setopt(local_830,CURLOPT_URL,local_788._M_dataplus._M_p);
      curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(data,CURLOPT_READDATA,local_768);
      curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar18);
      curl_easy_setopt(data,CURLOPT_ERRORBUFFER,local_438);
      curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      local_818 = (void *)0x0;
      pvStack_810 = (void *)0x0;
      local_808 = 0;
      local_748 = 0;
      local_758 = (void *)0x0;
      pvStack_750 = (void *)0x0;
      curl_easy_setopt(data,CURLOPT_WRITEDATA,&local_818);
      curl_easy_setopt(local_830,CURLOPT_DEBUGDATA,&local_758);
      CVar11 = curl_easy_perform(local_830);
      pcVar24 = local_820;
      if (local_818 != pvStack_810) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"CURL output: [",0xe);
        if (pvStack_810 != local_818) {
          std::ostream::write((char *)local_710,(long)local_818);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"]",1);
        cVar6 = (char)(ostream *)local_710;
        std::ios::widen((char)*(undefined8 *)((long)local_710 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x15d,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar25 = (long)pvStack_810 - (long)local_818;
        if (uVar25 == 0) {
          pcVar19 = (pointer)0x0;
        }
        else {
          if ((long)uVar25 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar19 = (pointer)operator_new(uVar25);
          pcVar24 = local_820;
        }
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar19 + uVar25;
        sVar27 = (long)pvStack_810 - (long)local_818;
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar19;
        if (sVar27 != 0) {
          local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = pcVar19;
          memmove(pcVar19,local_818,sVar27);
        }
        local_558.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar19 + sVar27;
        ParseResponse(pcVar24,&local_558);
        if (pcVar19 != (pointer)0x0) {
          operator_delete(pcVar19,uVar25);
        }
      }
      if (local_758 != pvStack_750) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"CURL debug output: [",0x14);
        if (pvStack_750 != local_758) {
          std::ostream::write((char *)local_710,(long)local_758);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"]",1);
        cVar6 = (char)(ostream *)local_710;
        std::ios::widen((char)*(undefined8 *)((long)local_710 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x166,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
      }
      if ((CVar11 != CURLE_OK) || (bVar8 = true, local_820->HasErrors == true)) {
        local_710 = (undefined1  [8])&local_700;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"RetryDelay","");
        pcVar24 = local_820;
        psVar20 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&local_820->super_cmCTestGenericHandler,(string *)local_710);
        if (psVar20 == (string *)0x0) {
          psVar20 = &cmValue::Empty_abi_cxx11_;
        }
        local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
        pcVar3 = (psVar20->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_860,pcVar3,pcVar3 + psVar20->_M_string_length);
        if (local_710 != (undefined1  [8])&local_700) {
          operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
        }
        local_710 = (undefined1  [8])&local_700;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"RetryCount","");
        psVar20 = (string *)
                  cmCTestGenericHandler::GetOption
                            (&pcVar24->super_cmCTestGenericHandler,(string *)local_710);
        if (psVar20 == (string *)0x0) {
          psVar20 = &cmValue::Empty_abi_cxx11_;
        }
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
        pcVar3 = (psVar20->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,pcVar3,pcVar3 + psVar20->_M_string_length);
        if (local_710 != (undefined1  [8])&local_700) {
          operator_delete((void *)local_710,local_700._M_allocated_capacity + 1);
        }
        sVar7 = local_860._M_string_length;
        psVar20 = &local_860;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_string_length ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_520,"CTestSubmitRetryDelay","");
          psVar20 = &local_478;
          cmCTest::GetCTestConfiguration(psVar20,pcVar2,&local_520);
        }
        iVar9 = atoi((psVar20->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
          }
        }
        sVar7 = local_7d8._M_string_length;
        psVar20 = &local_7d8;
        if (local_7d8._M_string_length == 0) {
          pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
          local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_540,"CTestSubmitRetryCount","");
          cmCTest::GetCTestConfiguration(&local_498,pcVar2,&local_540);
          psVar20 = &local_498;
        }
        iVar12 = atoi((psVar20->_M_dataplus)._M_p);
        if (sVar7 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
        }
        if (0 < iVar12) {
          local_4d8 = (double)iVar9;
          local_4e0 = local_4d8 * 1000000000.0;
          iVar9 = 0;
          do {
            while( true ) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_710,"   Submit failed, waiting ",0x1a);
              poVar13 = std::ostream::_M_insert<double>(local_4d8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," seconds...\n",0xc);
              pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x17d,local_7f8._M_dataplus._M_p,
                           (pcVar24->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
                operator_delete(local_7f8._M_dataplus._M_p,
                                local_7f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
              std::ios_base::~ios_base(local_6a0);
              lVar15 = std::chrono::_V2::steady_clock::now();
              local_718 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((double)lVar15 + local_4e0);
              while (lVar15 = std::chrono::_V2::steady_clock::now(),
                    (double)lVar15 < (double)local_718) {
                cmsys::SystemTools::Delay(100);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_710,"   Retry submission: Attempt ",0x1d);
              iVar9 = iVar9 + 1;
              poVar13 = (ostream *)std::ostream::operator<<(local_710,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," of ",4);
              plVar14 = (long *)std::ostream::operator<<(poVar13,iVar12);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x187,local_7f8._M_dataplus._M_p,
                           (pcVar24->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
                operator_delete(local_7f8._M_dataplus._M_p,
                                local_7f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
              std::ios_base::~ios_base(local_6a0);
              fclose(local_768);
              local_768 = (FILE *)cmsys::SystemTools::Fopen(&local_7b8,"rb");
              curl_easy_setopt(local_830,CURLOPT_READDATA,local_768);
              if (pvStack_810 != local_818) {
                pvStack_810 = local_818;
              }
              if (pvStack_750 != local_758) {
                pvStack_750 = local_758;
              }
              pcVar24->HasErrors = false;
              CVar11 = curl_easy_perform(local_830);
              if (local_818 != pvStack_810) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_710,"CURL output: [",0xe);
                if (pvStack_810 != local_818) {
                  std::ostream::write((char *)local_710,(long)local_818);
                  std::ostream::flush();
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"]",1);
                cVar6 = (char)(ostream *)local_710;
                std::ios::widen((char)*(undefined8 *)((long)local_710 + -0x18) + cVar6);
                std::ostream::put(cVar6);
                std::ostream::flush();
                pcVar2 = (pcVar24->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                             ,0x198,local_7f8._M_dataplus._M_p,
                             (pcVar24->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
                  operator_delete(local_7f8._M_dataplus._M_p,
                                  local_7f8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
                std::ios_base::~ios_base(local_6a0);
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                uVar25 = (long)pvStack_810 - (long)local_818;
                if (uVar25 == 0) {
                  pcVar19 = (pointer)0x0;
                }
                else {
                  if ((long)uVar25 < 0) {
                    std::__throw_bad_alloc();
                  }
                  pcVar19 = (pointer)operator_new(uVar25);
                }
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pcVar19 + uVar25;
                sVar27 = (long)pvStack_810 - (long)local_818;
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = pcVar19;
                if (sVar27 != 0) {
                  local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish = pcVar19;
                  memmove(pcVar19,local_818,sVar27);
                }
                pcVar24 = local_820;
                local_578.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish = pcVar19 + sVar27;
                ParseResponse(local_820,&local_578);
                if (pcVar19 != (pointer)0x0) {
                  operator_delete(pcVar19,uVar25);
                }
              }
              if (CVar11 != CURLE_OK) break;
              CVar11 = CURLE_OK;
              if ((pcVar24->HasErrors != true) || (iVar12 <= iVar9)) goto LAB_001f085a;
            }
          } while (iVar9 < iVar12);
          CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
        }
LAB_001f085a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        bVar8 = CVar11 == CURLE_OK;
      }
      fclose(local_768);
      if (bVar8) {
        curl_easy_cleanup(in_stack_fffffffffffff798);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::operator+(&local_860,"   Uploaded: ",&local_7b8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_710,local_860._M_dataplus._M_p,
                             local_860._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        pcVar24 = local_820;
        pcVar2 = (local_820->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1c0,local_860._M_dataplus._M_p,(pcVar24->super_cmCTestGenericHandler).Quiet)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"   Error when uploading file: ",0x1e);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_710,local_7b8._M_dataplus._M_p,
                             local_7b8._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar2 = (local_820->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a6,local_860._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"   Error message was: ",0x16);
        sVar27 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,local_438,sVar27);
        cVar6 = (char)(ostringstream *)local_710;
        std::ios::widen((char)*(undefined8 *)((long)local_710 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pcVar2 = (local_820->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a8,local_860._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_860._M_dataplus._M_p != &local_860.field_2) {
          operator_delete(local_860._M_dataplus._M_p,
                          CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                   local_860.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        poVar13 = local_820->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"   Error when uploading file: ",0x1e);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,local_7b8._M_dataplus._M_p,local_7b8._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        poVar13 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"   Error message was: ",0x16);
        sVar27 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,sVar27);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if (local_818 != pvStack_810) {
          poVar13 = local_820->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"   Curl output was: ",0x14);
          if (pvStack_810 != local_818) {
            std::ostream::write((char *)poVar13,(long)local_818);
            std::ostream::flush();
          }
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_710,"CURL output: [",0xe);
          if (pvStack_810 != local_818) {
            std::ostream::write((char *)local_710,(long)local_818);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"]",1);
          cVar6 = (char)(ostream *)local_710;
          std::ios::widen((char)*(undefined8 *)((long)local_710 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          pcVar2 = (local_820->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1b5,local_860._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_860._M_dataplus._M_p != &local_860.field_2) {
            operator_delete(local_860._M_dataplus._M_p,
                            CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                                     local_860.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
          std::ios_base::~ios_base(local_6a0);
        }
        curl_easy_cleanup(in_stack_fffffffffffff798);
        curl_slist_free_all(local_790);
        curl_global_cleanup();
      }
      if (local_758 != (void *)0x0) {
        operator_delete(local_758,local_748 - (long)local_758);
      }
      if (local_818 != (void *)0x0) {
        operator_delete(local_818,local_808 - (long)local_818);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_738._M_dataplus._M_p != &local_738.field_2) {
        operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      pcVar24 = local_820;
      if (!bVar8) goto LAB_001f0eec;
    }
    local_798 = local_798 + 1;
    local_821 = local_798 == local_4e8;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args = cmExpandedList(curlopt);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (cmIsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}